

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::RemoveInventory(AActor *this,AInventory *item)

{
  AActor *pAVar1;
  AInventory *pAVar2;
  AInventory *pAVar3;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar4;
  
  if ((item != (AInventory *)0x0) && (pAVar1 = (item->Owner).field_0.p, pAVar1 != (AActor *)0x0)) {
    paVar4 = &(item->Owner).field_0;
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar3 = (AInventory *)(((TObjPtr<AActor> *)paVar4)->field_0).p;
      if ((pAVar3 != (AInventory *)0x0) &&
         (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (((TObjPtr<AActor> *)paVar4)->field_0).p = (AActor *)0x0;
        pAVar3 = (AInventory *)0x0;
      }
      do {
        pAVar2 = pAVar3;
        pAVar3 = (pAVar2->super_AActor).Inventory.field_0.p;
        if (pAVar3 == (AInventory *)0x0) {
          return;
        }
      } while (pAVar3 != item);
      paVar4 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&(item->super_AActor).Inventory;
      pAVar3 = (item->super_AActor).Inventory.field_0.p;
      if ((pAVar3 != (AInventory *)0x0) &&
         (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (((TObjPtr<AInventory> *)paVar4)->field_0).p = (AInventory *)0x0;
        pAVar3 = (AInventory *)0x0;
      }
      (pAVar2->super_AActor).Inventory.field_0.p = pAVar3;
      (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2a])(item);
      (item->Owner).field_0.p = (AActor *)0x0;
    }
    paVar4->p = (AActor *)0x0;
  }
  return;
}

Assistant:

void AActor::RemoveInventory(AInventory *item)
{
	AInventory *inv, **invp;

	if (item != NULL && item->Owner != NULL)	// can happen if the owner was destroyed by some action from an item's use state.
	{
		invp = &item->Owner->Inventory;
		for (inv = *invp; inv != NULL; invp = &inv->Inventory, inv = *invp)
		{
			if (inv == item)
			{
				*invp = item->Inventory;
				item->DetachFromOwner();
				item->Owner = NULL;
				item->Inventory = NULL;
				break;
			}
		}
	}
}